

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_escape_sequence_abi_cxx11_
          (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  const_iterator rollback;
  undefined8 uVar4;
  long lVar5;
  value_type *pvVar6;
  location *loc_00;
  uint *loc_01;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  result<toml::detail::region,_toml::detail::none_t> token;
  string msg;
  allocator_type local_1d9;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [4];
  string local_168;
  undefined1 local_148 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_98 [80];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  rollback._M_current = *(char **)(this + 0x40);
  if ((rollback._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*rollback._M_current != '\\')
     ) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"toml::parse_escape_sequence: ","");
    source_location::source_location((source_location *)local_1b8,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[38],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_148,(source_location *)local_1b8,
               (char (*) [38])"the next token is not a backslash \"\\\"");
    __l._M_len = 1;
    __l._M_array = (iterator)local_148;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_d8,__l,(allocator_type *)&local_48);
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline(&local_1d8,&local_168,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_d8,&local_b8,false);
    local_98._16_8_ = local_1d8.field_2._M_allocated_capacity;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_98 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) {
      local_98._24_8_ = local_1d8.field_2._8_8_;
      local_98._0_8_ = paVar2;
    }
    else {
      local_98._0_8_ = local_1d8._M_dataplus._M_p;
    }
    local_1d8.field_2._M_allocated_capacity =
         local_1d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ == paVar2) {
      paVar1->_M_allocated_capacity = local_98._16_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
           local_98._24_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_98._0_8_;
      (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity = local_98._16_8_;
    }
    (__return_storage_ptr__->field_1).succ.value._M_string_length = local_1d8._M_string_length;
    local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
    local_98._8_8_ = 0;
    local_1d8._M_string_length = 0;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    local_98._0_8_ = paVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_148);
    source_location::~source_location((source_location *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p == &local_168.field_2) {
      return __return_storage_ptr__;
    }
    uVar9 = CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,local_168.field_2._M_local_buf[0]
                    );
    _Var10._M_p = local_168._M_dataplus._M_p;
LAB_0012d893:
    operator_delete(_Var10._M_p,uVar9 + 1);
  }
  else {
    lVar5 = (ulong)(*rollback._M_current == '\n') + *(long *)(this + 0x18);
    *(long *)(this + 0x18) = lVar5;
    *(char **)(this + 0x40) = rollback._M_current + 1;
    bVar3 = rollback._M_current[1];
    loc_00 = (location *)(ulong)bVar3;
    if (bVar3 < 0x62) {
      if (bVar3 == 0x22) {
        *(ulong *)(this + 0x18) = lVar5 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\"";
        pcVar7 = "";
      }
      else {
        if (bVar3 == 0x55) {
          sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>
          ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_1b8,(location *)this)
          ;
          if (local_1b8[0] != (string)0x1) {
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,
                       "parse_escape_sequence: invalid token found in UTF-8 codepoint Uxxxxxxxx","")
            ;
            source_location::source_location((source_location *)local_98,(location *)this);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[5],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_148,(source_location *)local_98,(char (*) [5])0x18a351);
            __l_02._M_len = 1;
            __l_02._M_array = (iterator)local_148;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_b8,__l_02,(allocator_type *)&local_1d9);
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_168,(string *)local_d8,
                             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_b8,&local_48,false);
            goto LAB_0012da25;
          }
          pvVar6 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                             ((result<toml::detail::region,_toml::detail::none_t> *)local_1b8);
          read_utf8_codepoint_abi_cxx11_((string *)local_98,(detail *)pvVar6,(region *)this,loc_00);
          goto LAB_0012d703;
        }
        if (bVar3 != 0x5c) goto switchD_0012d371_caseD_6f;
        *(ulong *)(this + 0x18) = lVar5 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\\";
        pcVar7 = "";
      }
    }
    else {
      loc_01 = &switchD_0012d371::switchdataD_00186254;
      switch(bVar3) {
      case 0x6e:
        *(ulong *)(this + 0x18) = lVar5 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\n";
        pcVar7 = "";
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_0012d371_caseD_6f:
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"parse_escape_sequence: unknown escape sequence appeared.",
                   "");
        source_location::source_location((source_location *)local_1b8,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[64],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_148,(source_location *)local_1b8,
                   (char (*) [64])
                   "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx");
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_148;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_d8,__l_00,(allocator_type *)&local_48);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,
                   "if you want to write backslash as just one backslash, use literal string like: regex    = \'<\\i\\c*\\s*>\'"
                   ,"");
        __l_01._M_len = 1;
        __l_01._M_array = &local_168;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_b8,__l_01,&local_1d9);
        format_underline((string *)local_98,&local_1d8,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_d8,&local_b8,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)local_148);
        source_location::~source_location((source_location *)local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        location::reset((location *)this,rollback);
        local_148._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_148 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,local_98._0_8_,(char *)(local_98._0_8_ + local_98._8_8_));
        __return_storage_ptr__->is_ok_ = false;
        paVar2 = &(__return_storage_ptr__->field_1).succ.value.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_1 = paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_148 + 0x10)) {
          paVar2->_M_allocated_capacity = local_148._16_8_;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           ((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) = _Stack_130._M_pi;
        }
        else {
          (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_148._0_8_;
          (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
               local_148._16_8_;
        }
        (__return_storage_ptr__->field_1).succ.value._M_string_length = local_148._8_8_;
        uVar9 = local_98._16_8_;
        _Var10._M_p = (pointer)local_98._0_8_;
        if ((undefined1 *)local_98._0_8_ == local_98 + 0x10) {
          return __return_storage_ptr__;
        }
        goto LAB_0012d893;
      case 0x72:
        *(ulong *)(this + 0x18) = lVar5 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\r";
        pcVar7 = "";
        break;
      case 0x74:
        *(ulong *)(this + 0x18) = lVar5 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\t";
        pcVar7 = "";
        break;
      case 0x75:
        sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>
        ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_1b8,(location *)this);
        if (local_1b8[0] != (string)0x1) {
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,
                     "parse_escape_sequence: invalid token found in UTF-8 codepoint uXXXX.","");
          source_location::source_location((source_location *)local_98,(location *)this);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[5],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_148,(source_location *)local_98,(char (*) [5])0x18a351);
          __l_03._M_len = 1;
          __l_03._M_array = (iterator)local_148;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_b8,__l_03,(allocator_type *)&local_1d9);
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_168,(string *)local_d8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_b8,&local_48,false);
LAB_0012da25:
          paVar2 = &local_1d8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p == &local_168.field_2) {
            local_1d8.field_2._8_8_ = local_168.field_2._8_8_;
            local_1d8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1d8._M_dataplus._M_p = local_168._M_dataplus._M_p;
          }
          local_1d8.field_2._M_allocated_capacity._1_7_ =
               local_168.field_2._M_allocated_capacity._1_7_;
          local_1d8.field_2._M_local_buf[0] = local_168.field_2._M_local_buf[0];
          __return_storage_ptr__->is_ok_ = false;
          paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_1 = paVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p == paVar2) {
            paVar1->_M_allocated_capacity = local_1d8.field_2._M_allocated_capacity;
            *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
                 local_1d8.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p =
                 local_1d8._M_dataplus._M_p;
            (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
                 local_1d8.field_2._M_allocated_capacity;
          }
          (__return_storage_ptr__->field_1).succ.value._M_string_length = local_168._M_string_length
          ;
          local_1d8.field_2._M_allocated_capacity =
               (ulong)(uint7)local_168.field_2._M_allocated_capacity._1_7_ << 8;
          local_168.field_2._M_local_buf[0] = '\0';
          local_168._M_string_length = 0;
          local_1d8._M_string_length = 0;
          local_1d8._M_dataplus._M_p = (pointer)paVar2;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_p != &local_e8) {
            operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_148);
          source_location::~source_location((source_location *)local_98);
          if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          goto LAB_0012db54;
        }
        pvVar6 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                           ((result<toml::detail::region,_toml::detail::none_t> *)local_1b8);
        read_utf8_codepoint_abi_cxx11_
                  ((string *)local_98,(detail *)pvVar6,(region *)this,(location *)loc_01);
LAB_0012d703:
        local_148._16_8_ = local_98._16_8_;
        uVar4 = local_98._8_8_;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_148 + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_98 + 0x10)) {
          _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_;
          local_148._0_8_ = paVar2;
        }
        else {
          local_148._0_8_ = local_98._0_8_;
        }
        local_98._8_8_ = 0;
        local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
        __return_storage_ptr__->is_ok_ = true;
        paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_1 = paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._0_8_ == paVar2) {
          paVar1->_M_allocated_capacity = local_148._16_8_;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           ((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) = _Stack_130._M_pi;
        }
        else {
          (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_148._0_8_;
          (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
               local_148._16_8_;
        }
        (__return_storage_ptr__->field_1).succ.value._M_string_length = uVar4;
        local_148._8_8_ = 0;
        local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
        local_148._0_8_ = paVar2;
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_98 + 0x10);
LAB_0012db54:
        if (local_1b8[0] != (string)0x1) {
          return __return_storage_ptr__;
        }
        region::~region((region *)(local_1b8 + 8));
        return __return_storage_ptr__;
      default:
        if (bVar3 == 0x62) {
          *(ulong *)(this + 0x18) = lVar5 + (ulong)(rollback._M_current[1] == '\n');
          *(char **)(this + 0x40) = rollback._M_current + 2;
          pcVar8 = "\b";
          pcVar7 = "";
        }
        else {
          if (bVar3 != 0x66) goto switchD_0012d371_caseD_6f;
          *(ulong *)(this + 0x18) = lVar5 + (ulong)(rollback._M_current[1] == '\n');
          *(char **)(this + 0x40) = rollback._M_current + 2;
          pcVar8 = "\f";
          pcVar7 = "";
        }
      }
    }
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar8,pcVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ == local_1a8) {
      _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8[0]._8_8_;
      local_148._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_148 + 0x10);
    }
    else {
      local_148._0_8_ = local_1b8._0_8_;
    }
    local_148._17_7_ = local_1a8[0]._M_allocated_capacity._1_7_;
    local_148[0x10] = local_1a8[0]._M_local_buf[0];
    __return_storage_ptr__->is_ok_ = true;
    paVar2 = &(__return_storage_ptr__->field_1).succ.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_148 + 0x10)) {
      paVar2->_M_allocated_capacity = local_148._16_8_;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) = _Stack_130._M_pi;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_148._0_8_;
      (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity = local_148._16_8_;
    }
    (__return_storage_ptr__->field_1).succ.value._M_string_length = local_1b8._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::string, std::string> parse_escape_sequence(location& loc)
{
    const auto first = loc.iter();
    if(first == loc.end() || *first != '\\')
    {
        return err(format_underline("toml::parse_escape_sequence: ", {{
            source_location(loc), "the next token is not a backslash \"\\\""}}));
    }
    loc.advance();
    switch(*loc.iter())
    {
        case '\\':{loc.advance(); return ok(std::string("\\"));}
        case '"' :{loc.advance(); return ok(std::string("\""));}
        case 'b' :{loc.advance(); return ok(std::string("\b"));}
        case 't' :{loc.advance(); return ok(std::string("\t"));}
        case 'n' :{loc.advance(); return ok(std::string("\n"));}
        case 'f' :{loc.advance(); return ok(std::string("\f"));}
        case 'r' :{loc.advance(); return ok(std::string("\r"));}
#ifdef TOML11_USE_UNRELEASED_TOML_FEATURES
        case 'e' :{loc.advance(); return ok(std::string("\x1b"));} // ESC
#endif
        case 'u' :
        {
            if(const auto token = lex_escape_unicode_short::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint uXXXX.",
                           {{source_location(loc), "here"}}));
            }
        }
        case 'U':
        {
            if(const auto token = lex_escape_unicode_long::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint Uxxxxxxxx",
                           {{source_location(loc), "here"}}));
            }
        }
    }

    const auto msg = format_underline("parse_escape_sequence: "
           "unknown escape sequence appeared.", {{source_location(loc),
           "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx"}},
           /* Hints = */{"if you want to write backslash as just one backslash, "
           "use literal string like: regex    = '<\\i\\c*\\s*>'"});
    loc.reset(first);
    return err(msg);
}